

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test.hpp
# Opt level: O1

bool libtest::unit_test<libtest::a_plus_b>::check<(anonymous_namespace)::ac>(path *input_file_path)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  undefined1 uVar5;
  int iVar6;
  istream *this;
  long *plVar7;
  long lVar8;
  undefined7 extraout_var;
  istream *piVar9;
  path *ppVar10;
  int b;
  path generated_out_path;
  path solution_out_path;
  int a;
  usize time_ms;
  time_point start;
  undefined1 *local_7f0;
  long local_7e8;
  undefined1 local_7e0;
  undefined7 uStack_7df;
  undefined4 local_7cc;
  ansi_sgr local_7c8;
  path local_7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_798;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_778;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_758;
  path local_738;
  path local_710;
  path local_6e8;
  path local_6c0;
  path local_698;
  path local_670;
  path local_648 [13];
  ulong local_440 [65];
  long local_238 [65];
  
  if ((check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file == '\0')
     && (iVar6 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                      ::input_file), iVar6 != 0)) {
    std::ifstream::ifstream
              (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file);
    __cxa_atexit(std::ifstream::~ifstream,
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::input_file
                 ,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                         input_file);
  }
  if ((check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
       generated_output_file == '\0') &&
     (iVar6 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                   ::generated_output_file), iVar6 != 0)) {
    std::ifstream::ifstream
              (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
               generated_output_file);
    __cxa_atexit(std::ifstream::~ifstream,
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 generated_output_file,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                         generated_output_file);
  }
  if ((check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
       solution_output_file_in == '\0') &&
     (iVar6 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                   ::solution_output_file_in), iVar6 != 0)) {
    std::ifstream::ifstream
              (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
               solution_output_file_in);
    __cxa_atexit(std::ifstream::~ifstream,
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file_in,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                         solution_output_file_in);
  }
  if ((check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::solution_output_file
       == '\0') &&
     (iVar6 = __cxa_guard_acquire(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                                   ::solution_output_file), iVar6 != 0)) {
    std::ofstream::ofstream
              (check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
               solution_output_file);
    __cxa_atexit(std::ofstream::~ofstream,
                 check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                 solution_output_file,&__dso_handle);
    __cxa_guard_release(&check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                         solution_output_file);
  }
  local_648[0]._M_pathname._M_dataplus._M_p = (pointer)0x20;
  printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)local_648,"[ RUN      ] ");
  sVar1 = (input_file_path->_M_pathname)._M_string_length;
  if (sVar1 == 0) {
LAB_00104961:
    std::filesystem::__cxx11::path::path(&local_738);
  }
  else {
    uVar2 = *(ulong *)&input_file_path->_M_cmpts;
    if ((uVar2 & 3) == 0) {
      if ((input_file_path->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/') {
        if ((uVar2 & 3) == 0) {
          lVar8 = std::filesystem::__cxx11::path::_List::end();
        }
        else {
          lVar8 = 0;
        }
        ppVar10 = (path *)(lVar8 + -0x30);
        if (((byte)input_file_path->_M_cmpts & 3) != 0) {
          ppVar10 = input_file_path;
        }
        if ((~*(uint *)&ppVar10->_M_cmpts & 3) == 0) goto LAB_0010491c;
      }
      goto LAB_00104961;
    }
    ppVar10 = input_file_path;
    if (((uint)uVar2 & 3) != 3) goto LAB_00104961;
LAB_0010491c:
    std::filesystem::__cxx11::path::path(&local_738,ppVar10);
  }
  cprintln<libtest::ansi_sgr,std::filesystem::__cxx11::path>((ansi_sgr)0x25,&local_738);
  std::filesystem::__cxx11::path::~path(&local_738);
  std::filesystem::__cxx11::path::path(&local_710,input_file_path);
  std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
            (local_648,(char (*) [5])".txt",auto_format);
  std::filesystem::__cxx11::path::replace_extension(&local_710);
  std::filesystem::__cxx11::path::~path(local_648);
  std::ifstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                      input_file,(_Ios_Openmode)(input_file_path->_M_pathname)._M_dataplus._M_p);
  std::ofstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                      solution_output_file,(_Ios_Openmode)local_710._M_pathname._M_dataplus._M_p);
  local_440[0] = 200;
  local_238[0] = std::chrono::_V2::system_clock::now();
  local_7c0._M_pathname._M_dataplus._M_p = (char *)0x0;
  local_648[0]._M_pathname._M_dataplus._M_p = (pointer)operator_new(0x18);
  *(undefined ***)local_648[0]._M_pathname._M_dataplus._M_p = &PTR___State_0010eca0;
  *(ulong **)((long)local_648[0]._M_pathname._M_dataplus._M_p + 8) = local_440;
  *(long **)((long)local_648[0]._M_pathname._M_dataplus._M_p + 0x10) = local_238;
  std::thread::_M_start_thread(&local_7c0,local_648,0);
  if ((long *)local_648[0]._M_pathname._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_648[0]._M_pathname._M_dataplus._M_p + 8))();
  }
  this = (istream *)
         std::istream::operator>>
                   ((istream *)
                    check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                    input_file,(int *)local_648);
  std::istream::operator>>(this,(int *)&local_7f0);
  plVar7 = (long *)std::ostream::operator<<
                             ((ostream *)
                              check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                              ::solution_output_file,
                              (int)local_7f0 + (int)local_648[0]._M_pathname._M_dataplus._M_p);
  std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
  std::ostream::put((char)plVar7);
  std::ostream::flush();
  lVar8 = std::chrono::_V2::system_clock::now();
  local_440[0] = (lVar8 - local_238[0]) / 1000000;
  std::thread::join();
  uVar2 = local_440[0];
  if (local_7c0._M_pathname._M_dataplus._M_p != (char *)0x0) {
    std::terminate();
  }
  std::ifstream::close();
  std::ofstream::close();
  if (uVar2 < 100) {
    std::filesystem::__cxx11::path::path(&local_7c0,input_file_path);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (local_648,(char (*) [5])".out",auto_format);
    std::filesystem::__cxx11::path::replace_extension(&local_7c0);
    std::filesystem::__cxx11::path::~path(local_648);
    cVar4 = std::filesystem::status(&local_7c0);
    if ((cVar4 == '\0') || (cVar4 == -1)) {
      local_648[0]._M_pathname._M_dataplus._M_p = (pointer)0x20;
      printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)local_648,"[       OK ] ");
      sVar1 = (input_file_path->_M_pathname)._M_string_length;
      if (sVar1 == 0) {
LAB_00104e4f:
        std::filesystem::__cxx11::path::path(&local_6e8);
      }
      else {
        uVar3 = *(ulong *)&input_file_path->_M_cmpts;
        if ((~(byte)uVar3 & 3) != 0) {
          if (((uVar3 & 3) == 0) &&
             ((input_file_path->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
            if ((uVar3 & 3) == 0) {
              lVar8 = std::filesystem::__cxx11::path::_List::end();
            }
            else {
              lVar8 = 0;
            }
            if (((byte)input_file_path->_M_cmpts & 3) == 0) {
              input_file_path = (path *)(lVar8 + -0x30);
            }
            if ((~*(uint *)&input_file_path->_M_cmpts & 3) == 0) goto LAB_00104e3d;
          }
          goto LAB_00104e4f;
        }
LAB_00104e3d:
        std::filesystem::__cxx11::path::path(&local_6e8,input_file_path);
      }
      cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                ((ansi_sgr)0x25,"% (% ms)\n",&local_6e8,uVar2);
      std::filesystem::__cxx11::path::~path(&local_6e8);
      uVar5 = 1;
    }
    else {
      std::ifstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                          input_file,(_Ios_Openmode)(input_file_path->_M_pathname)._M_dataplus._M_p)
      ;
      std::ifstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                          generated_output_file,
                          (_Ios_Openmode)local_7c0._M_pathname._M_dataplus._M_p);
      std::ifstream::open(check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)::
                          solution_output_file_in,
                          (_Ios_Openmode)local_710._M_pathname._M_dataplus._M_p);
      uVar5 = a_plus_b::judge((ifstream *)
                              check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                              ::input_file,
                              (ifstream *)
                              check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                              ::generated_output_file,
                              (ifstream *)
                              check<(anonymous_namespace)::ac>(std::filesystem::__cxx11::path_const&)
                              ::solution_output_file_in);
      if ((bool)uVar5) {
        local_648[0]._M_pathname._M_dataplus._M_p = (pointer)0x20;
        printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)local_648,"[       AC ] ");
        sVar1 = (input_file_path->_M_pathname)._M_string_length;
        if (sVar1 == 0) {
LAB_00104ec1:
          std::filesystem::__cxx11::path::path(&local_6c0);
        }
        else {
          uVar3 = *(ulong *)&input_file_path->_M_cmpts;
          if ((~(byte)uVar3 & 3) != 0) {
            if (((uVar3 & 3) == 0) &&
               ((input_file_path->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
              if ((uVar3 & 3) == 0) {
                lVar8 = std::filesystem::__cxx11::path::_List::end();
              }
              else {
                lVar8 = 0;
              }
              if (((byte)input_file_path->_M_cmpts & 3) == 0) {
                input_file_path = (path *)(lVar8 + -0x30);
              }
              if ((~*(uint *)&input_file_path->_M_cmpts & 3) == 0) goto LAB_00104eaf;
            }
            goto LAB_00104ec1;
          }
LAB_00104eaf:
          std::filesystem::__cxx11::path::path(&local_6c0,input_file_path);
        }
        cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                  ((ansi_sgr)0x25,"% (% ms)\n",&local_6c0,uVar2);
        std::filesystem::__cxx11::path::~path(&local_6c0);
      }
      else {
        local_648[0]._M_pathname._M_dataplus._M_p = (pointer)0x1f;
        printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)local_648,"[       WA ] ");
        sVar1 = (input_file_path->_M_pathname)._M_string_length;
        if (sVar1 == 0) {
LAB_00104f2d:
          std::filesystem::__cxx11::path::path(&local_698);
        }
        else {
          uVar3 = *(ulong *)&input_file_path->_M_cmpts;
          ppVar10 = input_file_path;
          if ((~(byte)uVar3 & 3) != 0) {
            if (((uVar3 & 3) == 0) &&
               ((input_file_path->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/')) {
              if ((uVar3 & 3) == 0) {
                lVar8 = std::filesystem::__cxx11::path::_List::end();
              }
              else {
                lVar8 = 0;
              }
              ppVar10 = (path *)(lVar8 + -0x30);
              if (((byte)input_file_path->_M_cmpts & 3) != 0) {
                ppVar10 = input_file_path;
              }
              if ((~*(uint *)&ppVar10->_M_cmpts & 3) == 0) goto LAB_00104f1e;
            }
            goto LAB_00104f2d;
          }
LAB_00104f1e:
          std::filesystem::__cxx11::path::path(&local_698,ppVar10);
        }
        cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
                  ((ansi_sgr)0x25,"% (% ms)\n",&local_698,uVar2);
        std::filesystem::__cxx11::path::~path(&local_698);
        std::ifstream::ifstream(local_648,(input_file_path->_M_pathname)._M_dataplus._M_p,_S_in);
        std::ifstream::ifstream((istream *)local_440,local_7c0._M_pathname._M_dataplus._M_p,_S_in);
        std::ifstream::ifstream((istream *)local_238,local_710._M_pathname._M_dataplus._M_p,_S_in);
        local_7cc = (undefined4)CONCAT71(extraout_var,uVar5);
        local_7f0 = &local_7e0;
        local_7e8 = 0;
        local_7e0 = 0;
        local_7c8.m_color = white;
        local_7c8.m_attr = reset;
        printer::cprintln<char_const*>((printer *)&g_printer,&local_7c8,"(Input)");
        while( true ) {
          cVar4 = std::ios::widen((char)*(undefined8 *)
                                         (local_648[0]._M_pathname._M_dataplus._M_p + -0x18) +
                                  (char)local_648);
          piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_648,(string *)&local_7f0,cVar4);
          if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
          local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_758,local_7f0,local_7f0 + local_7e8);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>((ansi_sgr)0x25,&local_758);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_758._M_dataplus._M_p != &local_758.field_2) {
            operator_delete(local_758._M_dataplus._M_p,local_758.field_2._M_allocated_capacity + 1);
          }
        }
        local_7c8.m_color = white;
        local_7c8.m_attr = reset;
        printer::cprintln<char_const*>((printer *)&g_printer,&local_7c8,"(Expected)");
        while( true ) {
          cVar4 = std::ios::widen((char)*(undefined8 *)(local_440[0] - 0x18) +
                                  (char)(istream *)local_440);
          piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_440,(string *)&local_7f0,cVar4);
          if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
          local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_778,local_7f0,local_7f0 + local_7e8);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>((ansi_sgr)0x25,&local_778);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_778._M_dataplus._M_p != &local_778.field_2) {
            operator_delete(local_778._M_dataplus._M_p,local_778.field_2._M_allocated_capacity + 1);
          }
        }
        local_7c8.m_color = white;
        local_7c8.m_attr = reset;
        printer::cprintln<char_const*>((printer *)&g_printer,&local_7c8,"(Output)");
        while( true ) {
          cVar4 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) +
                                  (char)(istream *)local_238);
          piVar9 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_238,(string *)&local_7f0,cVar4);
          if (((byte)piVar9[*(long *)(*(long *)piVar9 + -0x18) + 0x20] & 5) != 0) break;
          local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_798,local_7f0,local_7f0 + local_7e8);
          cprintln<libtest::ansi_sgr,std::__cxx11::string>((ansi_sgr)0x25,&local_798);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_798._M_dataplus._M_p != &local_798.field_2) {
            operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_7f0 != &local_7e0) {
          operator_delete(local_7f0,CONCAT71(uStack_7df,local_7e0) + 1);
        }
        std::ifstream::~ifstream(local_238);
        std::ifstream::~ifstream(local_440);
        std::ifstream::~ifstream(local_648);
        uVar5 = (undefined1)local_7cc;
      }
      std::ifstream::close();
    }
    std::filesystem::__cxx11::path::~path(&local_7c0);
    goto LAB_0010522e;
  }
  local_648[0]._M_pathname._M_dataplus._M_p = (pointer)0x1f;
  printer::cprintf<char_const*>((printer *)&g_printer,(ansi_sgr *)local_648,"[      TLE ] ");
  sVar1 = (input_file_path->_M_pathname)._M_string_length;
  if (sVar1 == 0) {
LAB_00104dde:
    std::filesystem::__cxx11::path::path(&local_670);
  }
  else {
    uVar3 = *(ulong *)&input_file_path->_M_cmpts;
    if ((~(byte)uVar3 & 3) != 0) {
      if (((uVar3 & 3) == 0) && ((input_file_path->_M_pathname)._M_dataplus._M_p[sVar1 - 1] != '/'))
      {
        if ((uVar3 & 3) == 0) {
          lVar8 = std::filesystem::__cxx11::path::_List::end();
        }
        else {
          lVar8 = 0;
        }
        if (((byte)input_file_path->_M_cmpts & 3) == 0) {
          input_file_path = (path *)(lVar8 + -0x30);
        }
        if ((~*(uint *)&input_file_path->_M_cmpts & 3) == 0) goto LAB_00104dcc;
      }
      goto LAB_00104dde;
    }
LAB_00104dcc:
    std::filesystem::__cxx11::path::path(&local_670,input_file_path);
  }
  cprintf<libtest::ansi_sgr,char_const*,std::filesystem::__cxx11::path,unsigned_long>
            ((ansi_sgr)0x25,"% (% ms)\n",&local_670,uVar2);
  std::filesystem::__cxx11::path::~path(&local_670);
  uVar5 = 0;
LAB_0010522e:
  std::ifstream::close();
  std::ifstream::close();
  std::ofstream::close();
  std::filesystem::__cxx11::path::~path(&local_710);
  return (bool)uVar5;
}

Assistant:

static bool check(const fs::path& input_file_path)
    {
        static std::ifstream input_file, generated_output_file, solution_output_file_in;
        static std::ofstream solution_output_file;
        cprintf(ac_color, "[ RUN      ] "), cprintln(message_color, input_file_path.filename());
        auto solution_out_path = input_file_path;
        solution_out_path.replace_extension(".txt");
        input_file.open(input_file_path), solution_output_file.open(solution_out_path);
        const usize time_ms = run([&]() { Solution::solve(input_file, solution_output_file); });
        input_file.close(), solution_output_file.close();
        bool passed = false;
        if (time_ms >= Problem::time_limit) {
            cprintf(tle_color, "[      TLE ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
        } else {
            auto generated_out_path = input_file_path;
            generated_out_path.replace_extension(".out");
            if (fs::exists(generated_out_path)) {
                input_file.open(input_file_path), generated_output_file.open(generated_out_path), solution_output_file_in.open(solution_out_path);
                const bool ok = Problem::judge(input_file, generated_output_file, solution_output_file_in);
                if (not ok) {
                    cprintf(wa_color, "[       WA ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    std::ifstream in_file{input_file_path}, gen_file{generated_out_path}, sol_file{solution_out_path};
                    std::string line;
                    cprintln(message_color, "(Input)");
                    while (std::getline(in_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Expected)");
                    while (std::getline(gen_file, line)) { cprintln(message_color, line); }
                    cprintln(message_color, "(Output)");
                    while (std::getline(sol_file, line)) { cprintln(message_color, line); }
                } else {
                    cprintf(ac_color, "[       AC ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                    passed = true;
                }
                solution_output_file_in.close();
            } else {
                cprintf(ac_color, "[       OK ] "), cprintf(message_color, "% (% ms)\n", input_file_path.filename(), time_ms);
                passed = true;
            }
        }
        generated_output_file.close(), input_file.close(), solution_output_file.close();
        return passed;
    }